

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void rhash_sha256_final(sha256_ctx *ctx,uchar *result)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  
  uVar1 = (uint)ctx->length;
  bVar4 = (byte)(uVar1 << 3);
  uVar1 = uVar1 >> 2 & 0xf;
  uVar3 = (ulong)uVar1;
  ctx->message[uVar3] = 0x80 << (bVar4 & 0x1f) ^ ~(-1 << (bVar4 & 0x1f)) & ctx->message[uVar3];
  if (uVar1 < 0xe) {
    uVar3 = uVar3 + 1;
  }
  else {
    if (uVar1 == 0xe) {
      ctx->message[0xf] = 0;
    }
    rhash_sha256_process_block(ctx->hash,ctx->message);
    uVar3 = 0;
  }
  for (; uVar3 < 0xe; uVar3 = uVar3 + 1) {
    ctx->message[uVar3] = 0;
  }
  uVar3 = ctx->length;
  uVar1 = (uint)(uVar3 >> 0x1d);
  ctx->message[0xe] =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  iVar2 = (int)uVar3;
  uVar1 = iVar2 << 3;
  ctx->message[0xf] =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | iVar2 << 0x1b;
  rhash_sha256_process_block(ctx->hash,ctx->message);
  if (result != (uchar *)0x0) {
    rhash_swap_copy_str_to_u32(result,0,ctx->hash,(ulong)ctx->digest_length);
    return;
  }
  return;
}

Assistant:

void rhash_sha256_final(sha256_ctx *ctx, unsigned char* result)
{
	size_t index = ((unsigned)ctx->length & 63) >> 2;
	unsigned shift = ((unsigned)ctx->length & 3) * 8;

	/* pad message and run for last block */

	/* append the byte 0x80 to the message */
	ctx->message[index]   &= le2me_32(~(0xFFFFFFFFu << shift));
	ctx->message[index++] ^= le2me_32(0x80u << shift);

	/* if no room left in the message to store 64-bit message length */
	if (index > 14) {
		/* then fill the rest with zeros and process it */
		while (index < 16) {
			ctx->message[index++] = 0;
		}
		rhash_sha256_process_block(ctx->hash, ctx->message);
		index = 0;
	}
	while (index < 14) {
		ctx->message[index++] = 0;
	}
	ctx->message[14] = be2me_32( (unsigned)(ctx->length >> 29) );
	ctx->message[15] = be2me_32( (unsigned)(ctx->length << 3) );
	rhash_sha256_process_block(ctx->hash, ctx->message);

	if (result) be32_copy(result, 0, ctx->hash, ctx->digest_length);
}